

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cc
# Opt level: O0

Scalar<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall iqxmlrpc::Value::cast<iqxmlrpc::Scalar<std::__cxx11::string>>(Value *this)

{
  Bad_cast *this_00;
  Scalar<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_38
  ;
  Scalar<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *t;
  Value *this_local;
  
  if (this->value == (Value_type *)0x0) {
    local_38 = (Scalar<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x0;
  }
  else {
    local_38 = (Scalar<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)__dynamic_cast(this->value,&Value_type::typeinfo,
                                 &Scalar<std::__cxx11::string>::typeinfo,0);
  }
  if (local_38 ==
      (Scalar<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
      0x0) {
    this_00 = (Bad_cast *)__cxa_allocate_exception(0x18);
    Bad_cast::Bad_cast(this_00);
    __cxa_throw(this_00,&Bad_cast::typeinfo,Bad_cast::~Bad_cast);
  }
  return local_38;
}

Assistant:

T* Value::cast() const
{
  T* t = dynamic_cast<T*>( value );
  if( !t )
    throw Bad_cast();
  return t;
}